

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O1

void LowererMD::LegalizeOpnds<false>
               (Instr *instr,LegalForms dstForms,LegalForms src1Forms,LegalForms src2Forms)

{
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  undefined4 *puVar4;
  LegalForms LVar5;
  uint uVar6;
  ulong uVar7;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x769,"(instr)","instr");
    if (!bVar2) goto LAB_0066eb9f;
    *puVar4 = 0;
  }
  if (((dstForms & LF_Optional) == L_None) &&
     ((instr->m_dst != (Opnd *)0x0) == (dstForms == L_None))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x76a,"(dstForms & LF_Optional || !instr->GetDst() == !dstForms)",
                       "dstForms & LF_Optional || !instr->GetDst() == !dstForms");
    if (!bVar2) goto LAB_0066eb9f;
    *puVar4 = 0;
  }
  if (((src1Forms & LF_Optional) == L_None) &&
     ((instr->m_src1 != (Opnd *)0x0) == (src1Forms == L_None))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x76b,"(src1Forms & LF_Optional || !instr->GetSrc1() == !src1Forms)",
                       "src1Forms & LF_Optional || !instr->GetSrc1() == !src1Forms");
    if (!bVar2) goto LAB_0066eb9f;
    *puVar4 = 0;
  }
  if (((src2Forms & LF_Optional) == L_None) &&
     ((instr->m_src2 != (Opnd *)0x0) == (src2Forms == L_None))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x76c,"(src2Forms & LF_Optional || !instr->GetSrc2() == !src2Forms)",
                       "src2Forms & LF_Optional || !instr->GetSrc2() == !src2Forms");
    if (!bVar2) goto LAB_0066eb9f;
    *puVar4 = 0;
  }
  if (src2Forms != L_None && src1Forms == L_None) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x76d,"(src1Forms || !src2Forms)","src1Forms || !src2Forms");
    if (!bVar2) {
LAB_0066eb9f:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if ((dstForms != L_None) && (instr->m_dst != (Opnd *)0x0)) {
    LegalizeDst<false>(instr,dstForms & L_FormMask | dstForms >> 1 & L_Imm32);
  }
  if (src1Forms == L_None) {
    return;
  }
  if (instr->m_src1 == (Opnd *)0x0) {
    return;
  }
  if ((instr->m_dst == (Opnd *)0x0) ||
     (OVar3 = IR::Opnd::GetKind(instr->m_dst), OpndKindMemRef < OVar3)) {
    uVar6 = 0;
  }
  else {
    uVar6 = 0x1480 >> (OVar3 & 0x1f);
  }
  uVar7 = (ulong)src1Forms;
  if (((src1Forms & L_Mem) != L_None) && ((uVar6 & 1) != 0)) {
    bVar2 = EncoderMD::IsOPEQ(instr);
    uVar7 = (ulong)(src1Forms & ~L_Mem);
    if (bVar2) {
      uVar7 = (ulong)src1Forms;
    }
  }
  LegalizeSrc<false>(instr,instr->m_src1,
                     (LegalForms)uVar7 & L_FormMask | (LegalForms)(uVar7 >> 1) & L_Imm32);
  OVar3 = IR::Opnd::GetKind(instr->m_src1);
  LVar5 = src2Forms;
  if ((0x1480U >> (OVar3 & 0x1f) & 1) != 0) {
    LVar5 = src2Forms ^ L_Mem;
  }
  if (OpndKindMemRef < OVar3) {
    LVar5 = src2Forms;
  }
  if ((uVar6 & 1) != 0) {
    LVar5 = src2Forms ^ L_Mem;
  }
  if ((src2Forms & L_Mem) == L_None) {
    LVar5 = src2Forms;
  }
  if ((LVar5 != L_None) && (instr->m_src2 != (Opnd *)0x0)) {
    LegalizeSrc<false>(instr,instr->m_src2,LVar5 & L_FormMask | LVar5 >> 1 & L_Imm32);
    return;
  }
  return;
}

Assistant:

void LowererMD::LegalizeOpnds(IR::Instr *const instr, const LegalForms dstForms, LegalForms src1Forms, LegalForms src2Forms)
{
    Assert(instr);
    Assert(dstForms & LF_Optional || !instr->GetDst() == !dstForms);
    Assert(src1Forms & LF_Optional || !instr->GetSrc1() == !src1Forms);
    Assert(src2Forms & LF_Optional || !instr->GetSrc2() == !src2Forms);
    Assert(src1Forms || !src2Forms);

    const auto NormalizeForms = [](LegalForms forms) -> LegalForms
    {
    #ifdef _M_X64
        if(forms & L_Ptr)
        {
            forms |= L_Imm32;
        }
    #else
        if(forms & (L_Imm32 | L_Ptr))
        {
            forms |= L_Imm32 | L_Ptr;
        }
    #endif
        // Remove Legal Flags
        forms &= L_FormMask;
        return forms;
    };

    if(dstForms && instr->GetDst())
    {
        LegalizeDst<verify>(instr, NormalizeForms(dstForms));
    }
    if(!src1Forms || !instr->GetSrc1())
    {
        return;
    }
    bool hasMemOpnd = instr->GetDst() && instr->GetDst()->IsMemoryOpnd();

    // Allow src1 to be a mem opnd if dst & src1 must be the same
    if (hasMemOpnd && src1Forms & L_Mem && !EncoderMD::IsOPEQ(instr))
    {
        src1Forms ^= L_Mem;
    }
    LegalizeSrc<verify>(instr, instr->GetSrc1(), NormalizeForms(src1Forms));

    hasMemOpnd |= instr->GetSrc1()->IsMemoryOpnd();
    // If dst or src1 is a mem opnd, mem2 cannot be a mem opnd
    if(hasMemOpnd && src2Forms & L_Mem)
    {
        src2Forms ^= L_Mem;
    }
    if(src2Forms && instr->GetSrc2())
    {
        LegalizeSrc<verify>(instr, instr->GetSrc2(), NormalizeForms(src2Forms));
    }
}